

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::setItemsGeometries(QGraphicsAnchorLayoutPrivate *this,QRectF *geom)

{
  bool bVar1;
  LayoutDirection LVar2;
  QGraphicsAnchorLayout *pQVar3;
  QGraphicsLayoutItem **ppQVar4;
  AnchorVertex *pAVar5;
  QRectF *in_RSI;
  QGraphicsAnchorLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar6;
  add_const_t<QList<QGraphicsLayoutItem_*>_> *__range1;
  LayoutDirection visualDir;
  AnchorVertex *secondV;
  AnchorVertex *firstV;
  AnchorVertex *secondH;
  AnchorVertex *firstH;
  QGraphicsAnchorLayout *q;
  QSizeF itemPreferredSize;
  QRectF newGeom;
  QGraphicsLayoutItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  qreal right;
  qreal left;
  qreal top;
  double *in_stack_ffffffffffffff28;
  QGraphicsLayoutItem *value;
  QGraphicsLayoutPrivate *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  QGraphicsAnchorLayoutPrivate *this_00;
  AnchorVertex *pAVar7;
  AnchorVertex *this_01;
  QSizeF local_80;
  QSizeF local_70;
  QRectF local_60;
  QGraphicsLayoutItem *local_40;
  QGraphicsLayoutItem **local_38;
  const_iterator local_30;
  const_iterator local_28;
  double local_20;
  double local_18;
  double local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  this_01 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
  pAVar7 = (AnchorVertex *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QGraphicsAnchorLayoutPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = -NAN;
  local_18 = -NAN;
  local_20 = -NAN;
  (*(pQVar3->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[3])
            (pQVar3,&local_18,&local_10,&local_20,0);
  LVar2 = QGraphicsLayoutPrivate::visualDirection(in_stack_ffffffffffffff38);
  if (LVar2 == RightToLeft) {
    qSwap<double>((double *)in_RDI,in_stack_ffffffffffffff28);
  }
  qVar6 = QRectF::left(in_RSI);
  local_18 = qVar6 + local_18;
  qVar6 = QRectF::top(in_RSI);
  local_10 = qVar6 + local_10;
  qVar6 = QRectF::right(in_RSI);
  local_20 = qVar6 - local_20;
  local_28.i = (QGraphicsLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_28 = QList<QGraphicsLayoutItem_*>::begin((QList<QGraphicsLayoutItem_*> *)in_RDI);
  local_30.i = (QGraphicsLayoutItem **)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QGraphicsLayoutItem_*>::end((QList<QGraphicsLayoutItem_*> *)in_RDI);
  while( true ) {
    local_38 = local_30.i;
    bVar1 = QList<QGraphicsLayoutItem_*>::const_iterator::operator!=(&local_28,local_30);
    if (!bVar1) break;
    ppQVar4 = QList<QGraphicsLayoutItem_*>::const_iterator::operator*(&local_28);
    local_40 = *ppQVar4;
    local_60.xp = -NAN;
    local_60.yp = -NAN;
    local_60.w = -NAN;
    local_60.h = -NAN;
    QRectF::QRectF(&local_60);
    local_70.ht = -NAN;
    local_70.wd = -NAN;
    value = local_40;
    QSizeF::QSizeF(&local_80);
    local_70 = QGraphicsLayoutItem::effectiveSizeHint
                         ((QGraphicsLayoutItem *)this_01,(SizeHint)((ulong)pAVar7 >> 0x20),
                          (QSizeF *)this_00);
    QHVContainer<QSet<QGraphicsLayoutItem_*>_>::operator[]
              ((QHVContainer<QSet<QGraphicsLayoutItem_*>_> *)in_RDI,
               (Orientation)((ulong)value >> 0x20));
    bVar1 = QSet<QGraphicsLayoutItem_*>::contains
                      ((QSet<QGraphicsLayoutItem_*> *)in_RDI,(QGraphicsLayoutItem **)value);
    if (bVar1) {
      QRectF::setLeft(&local_60,0.0);
      qVar6 = QSizeF::width(&local_70);
      QRectF::setRight(&local_60,qVar6);
    }
    else {
      pAVar5 = internalVertex(this_00,(QGraphicsLayoutItem *)
                                      CONCAT44(LVar2,in_stack_ffffffffffffff40),
                              (AnchorPoint)((ulong)this_01 >> 0x20));
      this_01 = internalVertex(this_00,(QGraphicsLayoutItem *)
                                       CONCAT44(LVar2,in_stack_ffffffffffffff40),
                               (AnchorPoint)((ulong)this_01 >> 0x20));
      if (LVar2 == LeftToRight) {
        QRectF::setLeft(&local_60,local_18 + pAVar5->distance);
        QRectF::setRight(&local_60,local_18 + this_01->distance);
      }
      else {
        QRectF::setLeft(&local_60,local_20 - this_01->distance);
        QRectF::setRight(&local_60,local_20 - pAVar5->distance);
      }
    }
    QHVContainer<QSet<QGraphicsLayoutItem_*>_>::operator[]
              ((QHVContainer<QSet<QGraphicsLayoutItem_*>_> *)in_RDI,
               (Orientation)((ulong)value >> 0x20));
    bVar1 = QSet<QGraphicsLayoutItem_*>::contains
                      ((QSet<QGraphicsLayoutItem_*> *)in_RDI,(QGraphicsLayoutItem **)value);
    if (bVar1) {
      QRectF::setTop(&local_60,0.0);
      qVar6 = QSizeF::height(&local_70);
      QRectF::setBottom(&local_60,qVar6);
    }
    else {
      pAVar7 = internalVertex(this_00,(QGraphicsLayoutItem *)
                                      CONCAT44(LVar2,in_stack_ffffffffffffff40),
                              (AnchorPoint)((ulong)this_01 >> 0x20));
      this_00 = (QGraphicsAnchorLayoutPrivate *)
                internalVertex(this_00,(QGraphicsLayoutItem *)
                                       CONCAT44(LVar2,in_stack_ffffffffffffff40),
                               (AnchorPoint)((ulong)this_01 >> 0x20));
      QRectF::setTop(&local_60,local_10 + pAVar7->distance);
      QRectF::setBottom(&local_60,
                        local_10 +
                        (double)(this_00->super_QGraphicsLayoutPrivate).
                                super_QGraphicsLayoutItemPrivate.userSizeHints);
    }
    (*local_40->_vptr_QGraphicsLayoutItem[2])(local_40,&local_60);
    QList<QGraphicsLayoutItem_*>::const_iterator::operator++(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setItemsGeometries(const QRectF &geom)
{
    Q_Q(QGraphicsAnchorLayout);
    AnchorVertex *firstH, *secondH, *firstV, *secondV;

    qreal top;
    qreal left;
    qreal right;

    q->getContentsMargins(&left, &top, &right, nullptr);
    const Qt::LayoutDirection visualDir = visualDirection();
    if (visualDir == Qt::RightToLeft)
        qSwap(left, right);

    left += geom.left();
    top += geom.top();
    right = geom.right() - right;

    for (QGraphicsLayoutItem *item : std::as_const(items)) {
        QRectF newGeom;
        QSizeF itemPreferredSize = item->effectiveSizeHint(Qt::PreferredSize);
        if (m_floatItems[Qt::Horizontal].contains(item)) {
            newGeom.setLeft(0);
            newGeom.setRight(itemPreferredSize.width());
        } else {
            firstH = internalVertex(item, Qt::AnchorLeft);
            secondH = internalVertex(item, Qt::AnchorRight);

            if (visualDir == Qt::LeftToRight) {
                newGeom.setLeft(left + firstH->distance);
                newGeom.setRight(left + secondH->distance);
            } else {
                newGeom.setLeft(right - secondH->distance);
                newGeom.setRight(right - firstH->distance);
            }
        }

        if (m_floatItems[Qt::Vertical].contains(item)) {
            newGeom.setTop(0);
            newGeom.setBottom(itemPreferredSize.height());
        } else {
            firstV = internalVertex(item, Qt::AnchorTop);
            secondV = internalVertex(item, Qt::AnchorBottom);

            newGeom.setTop(top + firstV->distance);
            newGeom.setBottom(top + secondV->distance);
        }

        item->setGeometry(newGeom);
    }
}